

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

UnqualifiedName * __thiscall
soul::PoolAllocator::allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
          (PoolAllocator *this,Context *args,Identifier *args_1)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0x38);
  AST::UnqualifiedName::UnqualifiedName
            ((UnqualifiedName *)&pPVar1->item,args,(Identifier)args_1->name);
  pPVar1->destructor =
       allocate<soul::AST::UnqualifiedName,_soul::AST::Context_&,_soul::Identifier>::
       anon_class_1_0_00000001::__invoke;
  return (UnqualifiedName *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }